

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O2

int WebPSaveImage(WebPDecBuffer *buffer,WebPOutputFileFormat format,char *out_file_name)

{
  uint uVar1;
  FILE *__stream;
  
  uVar1 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && out_file_name != (char *)0x0) {
    if ((*out_file_name == '-') && (out_file_name[1] == '\0')) {
      __stream = (FILE *)ImgIoUtilSetBinaryMode((FILE *)_stdout);
    }
    else {
      __stream = fopen(out_file_name,"wb");
    }
    if (__stream == (FILE *)0x0) {
      uVar1 = 0;
      fprintf(stderr,"Error opening output file %s\n",out_file_name);
    }
    else {
      switch(format) {
      case PNG:
      case RGBA:
      case BGRA:
      case ARGB:
      case rgbA:
      case bgrA:
      case Argb:
        uVar1 = WebPWritePNG((FILE *)__stream,buffer);
        break;
      case PAM:
        uVar1 = WebPWritePAM((FILE *)__stream,buffer);
        break;
      case PPM:
      case RGB:
      case BGR:
        uVar1 = WebPWritePPM((FILE *)__stream,buffer);
        break;
      case PGM:
      case YUV:
      case YUVA:
        uVar1 = WebPWritePGM((FILE *)__stream,buffer);
        break;
      case BMP:
        uVar1 = WebPWriteBMP((FILE *)__stream,buffer);
        uVar1 = uVar1 & 1;
        break;
      case TIFF:
        uVar1 = WebPWriteTIFF((FILE *)__stream,buffer);
        break;
      case RAW_YUV:
        uVar1 = WebPWriteYUV((FILE *)__stream,buffer);
        break;
      case ALPHA_PLANE_ONLY:
        uVar1 = WebPWriteAlphaPlane((FILE *)__stream,buffer);
        break;
      case RGBA_4444:
      case RGB_565:
      case rgbA_4444:
        uVar1 = WebPWrite16bAsPGM((FILE *)__stream,buffer);
        break;
      default:
        uVar1 = 1;
      }
      if (__stream != _stdout) {
        fclose(__stream);
      }
    }
  }
  return uVar1;
}

Assistant:

int WebPSaveImage(const WebPDecBuffer* const buffer,
                  WebPOutputFileFormat format,
                  const char* const out_file_name) {
  FILE* fout = NULL;
  int needs_open_file = 1;
  const int use_stdout =
      (out_file_name != NULL) && !WSTRCMP(out_file_name, "-");
  int ok = 1;

  if (buffer == NULL || out_file_name == NULL) return 0;

#ifdef HAVE_WINCODEC_H
  needs_open_file = (format != PNG);
#endif

  if (needs_open_file) {
    fout = use_stdout ? ImgIoUtilSetBinaryMode(stdout)
                      : WFOPEN(out_file_name, "wb");
    if (fout == NULL) {
      WFPRINTF(stderr, "Error opening output file %s\n",
               (const W_CHAR*)out_file_name);
      return 0;
    }
  }

  if (format == PNG ||
      format == RGBA || format == BGRA || format == ARGB ||
      format == rgbA || format == bgrA || format == Argb) {
#ifdef HAVE_WINCODEC_H
    ok &= WebPWritePNG(out_file_name, use_stdout, buffer);
#else
    ok &= WebPWritePNG(fout, buffer);
#endif
  } else if (format == PAM) {
    ok &= WebPWritePAM(fout, buffer);
  } else if (format == PPM || format == RGB || format == BGR) {
    ok &= WebPWritePPM(fout, buffer);
  } else if (format == RGBA_4444 || format == RGB_565 || format == rgbA_4444) {
    ok &= WebPWrite16bAsPGM(fout, buffer);
  } else if (format == BMP) {
    ok &= WebPWriteBMP(fout, buffer);
  } else if (format == TIFF) {
    ok &= WebPWriteTIFF(fout, buffer);
  } else if (format == RAW_YUV) {
    ok &= WebPWriteYUV(fout, buffer);
  } else if (format == PGM || format == YUV || format == YUVA) {
    ok &= WebPWritePGM(fout, buffer);
  } else if (format == ALPHA_PLANE_ONLY) {
    ok &= WebPWriteAlphaPlane(fout, buffer);
  }
  if (fout != NULL && fout != stdout) {
    fclose(fout);
  }
  return ok;
}